

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

World * rw::World::create(BBox *bbox)

{
  FILE *__stream;
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  Error local_28;
  Error _e;
  World *world;
  BBox *bbox_local;
  
  _e = (Error)malloc_LOC((long)(int)s_plglist,0x3000b,
                         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/world.cpp line: 24"
                        );
  if (_e == (Error)0x0) {
    local_28.plugin = 0xb;
    local_28.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/world.cpp",0x1a);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_28);
    bbox_local = (BBox *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    ctx = (EVP_PKEY_CTX *)0x7;
    Object::init((Object *)_e,(EVP_PKEY_CTX *)0x7);
    LinkList::init((LinkList *)((long)_e + 0x10),ctx);
    LinkList::init((LinkList *)((long)_e + 0x20),ctx);
    LinkList::init((LinkList *)((long)_e + 0x30),ctx);
    PluginList::construct((PluginList *)&s_plglist,(void *)_e);
    bbox_local = (BBox *)_e;
  }
  return (World *)bbox_local;
}

Assistant:

World*
World::create(BBox *bbox)
{
	World *world = (World*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_WORLD);
	if(world == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	world->object.init(World::ID, 0);
	world->localLights.init();
	world->globalLights.init();
	world->clumps.init();
	s_plglist.construct(world);
	return world;
}